

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

void __thiscall Graph::~Graph(Graph *this)

{
  pointer pLVar1;
  Vertex *pVVar2;
  Vertex *this_00;
  Vertex *pVVar3;
  Edge *this_01;
  
  this_00 = (Vertex *)operator_new(0x78);
  Vertex::Vertex(this_00,0,1);
  pVVar2 = this->verticesList;
  while (pVVar3 = pVVar2, pVVar3 != (Vertex *)0x0) {
    Vertex::~Vertex(this_00);
    operator_delete(this_00,0x78);
    for (this_01 = pVVar3->edgesList; this_01 != (Edge *)0x0; this_01 = this_01->nextEdge) {
      Edge::~Edge(this_01);
      operator_delete(this_01,0x60);
    }
    this_00 = pVVar3;
    pVVar2 = pVVar3->nextVertex;
  }
  Vertex::~Vertex(this_00);
  operator_delete(this_00,0x78);
  pLVar1 = (this->loads).super__Vector_base<LoadLevel,_std::allocator<LoadLevel>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pLVar1 != (pointer)0x0) {
    operator_delete(pLVar1,(long)(this->loads).
                                 super__Vector_base<LoadLevel,_std::allocator<LoadLevel>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pLVar1);
  }
  std::vector<Capacitor,_std::allocator<Capacitor>_>::~vector(&this->capacitorType);
  return;
}

Assistant:

Graph::~Graph(){
    Vertex *aux = new Vertex(0);
    for(Vertex *v=this->verticesList; v != NULL; v= v->getNext()){
        delete aux;
        for(Edge *e= v->getEdgesList(); e != NULL; e= e->getNext()){
            delete e;
        }
        aux = v;
    }
    delete aux;
}